

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleElement.cpp
# Opt level: O2

ssize_t __thiscall DoubleElement::read(DoubleElement *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  ostream *poVar3;
  byte bVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  double dVar6;
  string tmpStr;
  string local_58;
  string local_38;
  
  tmpStr._M_dataplus._M_p = (pointer)&tmpStr.field_2;
  tmpStr._M_string_length = 0;
  tmpStr.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)CONCAT44(in_register_00000034,__fd),(string *)&tmpStr);
  dVar6 = atof(tmpStr._M_dataplus._M_p);
  bVar1 = std::operator!=(&tmpStr,"0");
  uVar5 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
  bVar4 = (byte)uVar5 & dVar6 == 0.0;
  if (bVar4 == 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error (DoubleElement): Entry ");
    iVar2 = StreamObject::getOffset(&this->super_StreamObject);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2 + 1);
    poVar3 = std::operator<<(poVar3," in \"<");
    StreamObject::getParentName_abi_cxx11_(&local_38,&this->super_StreamObject);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    poVar3 = std::operator<<(poVar3,"></");
    StreamObject::getParentName_abi_cxx11_(&local_58,&this->super_StreamObject);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    std::operator<<(poVar3,">\" - Section is not a valid double number!\n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    this->_value = dVar6;
    Object::setInitState(&(this->super_StreamObject).super_Object,true);
  }
  std::__cxx11::string::~string((string *)&tmpStr);
  return CONCAT71((int7)(uVar5 >> 8),bVar4) ^ 1;
}

Assistant:

bool DoubleElement::read( std::stringstream &f )
{
	/*-----------------------------------------
		   Read real number
	------------------------------------------*/
	std::string tmpStr;
	f >> tmpStr;


	double tmpVal = atof( tmpStr.c_str() );
	if (( tmpStr != "0" ) && ( tmpVal == 0 ) )
	{
		std::cerr << "Error (DoubleElement): Entry " << getOffset() + 1 << " in \"<"
		<< getParentName() << "></" << getParentName() << ">\" - Section is not a valid double number!\n";
		return false;
	}
	_value = tmpVal;

	setInitState( true );

	return true;

}